

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f * __thiscall Matrix4f::transposed(Matrix4f *__return_storage_ptr__,Matrix4f *this)

{
  Matrix4f *pMVar1;
  int i;
  long lVar2;
  Matrix4f *out;
  long lVar3;
  
  pMVar1 = __return_storage_ptr__;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(float *)((long)__return_storage_ptr__ + lVar3) = *(float *)((long)this + lVar3 * 4);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    lVar2 = lVar2 + 1;
    this = (Matrix4f *)((long)this + 4);
    __return_storage_ptr__ = (Matrix4f *)((long)__return_storage_ptr__ + 0x10);
  } while (lVar2 != 4);
  return pMVar1;
}

Assistant:

Matrix4f Matrix4f::transposed() const
{
	Matrix4f out;
	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}